

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPool.cpp
# Opt level: O3

void __thiscall primesieve::MemoryPool::initBuckets(MemoryPool *this,void *memory,size_t bytes)

{
  long *plVar1;
  long lVar2;
  runtime_error *prVar3;
  long *plVar4;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this->count_ = bytes >> 0xd;
  if (((ulong)memory & 0x1fff) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"MemoryPool: failed to align memory!","");
    std::runtime_error::runtime_error(prVar3,(string *)local_40);
    *(undefined ***)prVar3 = &PTR__runtime_error_0013f950;
    __cxa_throw(prVar3,&primesieve_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0x13fff < bytes) {
    lVar2 = (bytes >> 0xd) - 1;
    plVar1 = (long *)((long)memory + 0x2000);
    do {
      plVar4 = plVar1;
      plVar4[-0x400] = (long)(plVar4 + -0x3fe);
      plVar4[-0x3ff] = (long)plVar4;
      lVar2 = lVar2 + -1;
      plVar1 = plVar4 + 0x400;
    } while (lVar2 != 0);
    *plVar4 = (long)(plVar4 + 2);
    plVar4[1] = 0;
    this->stock_ = (Bucket *)memory;
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"MemoryPool: insufficient buckets allocated!","");
  std::runtime_error::runtime_error(prVar3,(string *)local_40);
  *(undefined ***)prVar3 = &PTR__runtime_error_0013f950;
  __cxa_throw(prVar3,&primesieve_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MemoryPool::initBuckets(void* memory, size_t bytes)
{
  Bucket* buckets = (Bucket*) memory;
  count_ = bytes / sizeof(Bucket);
  size_t i = 0;

  if ((size_t) buckets % sizeof(Bucket) != 0)
    throw primesieve_error("MemoryPool: failed to align memory!");

  if (count_ < 10)
    throw primesieve_error("MemoryPool: insufficient buckets allocated!");

  for (; i + 1 < count_; i++)
  {
    buckets[i].reset();
    buckets[i].setNext(&buckets[i + 1]);
  }

  buckets[i].reset();
  buckets[i].setNext(nullptr);
  stock_ = buckets;
}